

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.h
# Opt level: O1

uint __thiscall CVmObjCharSet::calc_hash(CVmObjCharSet *this,vm_obj_id_t self,int param_2)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  
  pcVar1 = (this->super_CVmObject).ext_;
  lVar2 = *(long *)(pcVar1 + 0x10);
  if (lVar2 != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + (int)pcVar1[lVar4 + 0x18];
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
    return uVar3;
  }
  return 0;
}

Assistant:

const struct vmobj_charset_ext_t *get_ext_ptr() const
        { return (vmobj_charset_ext_t *)ext_; }